

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afcjk.c
# Opt level: O2

FT_Error af_cjk_metrics_init(AF_CJKMetrics metrics,FT_Face face)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  FT_CharMap pFVar4;
  FT_GlyphSlot pFVar5;
  FT_Vector *pFVar6;
  bool bVar7;
  FT_Face pFVar8;
  char cVar9;
  FT_Error FVar10;
  AF_Blue_StringRec *pAVar11;
  long lVar12;
  AF_CJKBlueRec *pAVar13;
  uint count;
  uint count_00;
  long lVar14;
  AF_CJKAxisRec *pAVar15;
  byte bVar16;
  FT_Pos *pFVar17;
  undefined7 uVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  char *pcVar23;
  char *p;
  FT_Vector *pFVar24;
  uint local_3ac;
  FT_Face local_3a8;
  AF_CJKMetrics local_3a0;
  FT_Pos *local_398;
  FT_CharMap local_390;
  AF_CJKAxisRec *local_388;
  AF_CJKAxisRec *local_380;
  AF_Blue_StringRec *local_378;
  FT_ULong shaper_buf_;
  FT_Pos flats [51];
  FT_Pos fills [51];
  
  pFVar4 = face->charmap;
  metrics->units_per_em = (uint)face->units_per_EM;
  FVar10 = FT_Select_Charmap(face,FT_ENCODING_UNICODE);
  local_390 = pFVar4;
  if (FVar10 == 0) {
    local_3a8 = face;
    af_cjk_metrics_init_widths(metrics,face);
    local_380 = metrics->axis;
    local_388 = metrics->axis + 1;
    pAVar11 = af_blue_stringsets + ((metrics->root).style_class)->blue_stringset;
    local_3a0 = metrics;
    while ((ulong)pAVar11->string != 0x159b) {
      pcVar23 = af_blue_strings + pAVar11->string;
      uVar1 = pAVar11->properties;
      count_00 = 0;
      bVar7 = true;
      count = 0;
      local_378 = pAVar11;
LAB_00225729:
      cVar9 = *pcVar23;
      p = pcVar23;
      if (cVar9 != '\0') {
        while (pcVar23 = p + 1, cVar9 == ' ') {
          p = pcVar23;
          cVar9 = *pcVar23;
        }
        if (cVar9 != '|') goto LAB_00225754;
        goto LAB_0022574a;
      }
      if (count_00 != 0 || count != 0) {
        pAVar15 = local_380;
        if ((uVar1 & 2) == 0) {
          pAVar15 = local_388;
        }
        af_sort_pos(count,fills);
        pFVar17 = flats;
        af_sort_pos(count_00,pFVar17);
        uVar3 = pAVar15->blue_count;
        pAVar13 = pAVar15->blues + uVar3;
        pAVar15->blue_count = uVar3 + 1;
        if (count_00 == 0) {
          lVar12 = fills[count >> 1];
LAB_002259ac:
          pAVar15->blues[uVar3].shoot.org = lVar12;
          (pAVar13->ref).org = lVar12;
          lVar14 = lVar12;
        }
        else {
          if (count == 0) {
            lVar12 = flats[count_00 >> 1];
            goto LAB_002259ac;
          }
          lVar14 = fills[count >> 1];
          (pAVar13->ref).org = lVar14;
          lVar12 = flats[count_00 >> 1];
          pAVar15->blues[uVar3].shoot.org = lVar12;
        }
        uVar18 = (undefined7)((ulong)pFVar17 >> 8);
        face = (FT_Face)CONCAT71(uVar18,lVar14 <= lVar12);
        if ((lVar12 != lVar14) &&
           (bVar16 = lVar14 <= lVar12 ^ (byte)uVar1, face = (FT_Face)CONCAT71(uVar18,bVar16),
           (bVar16 & 1) == 0)) {
          face = (FT_Face)0x2;
          lVar12 = (lVar12 + lVar14) / 2;
          pAVar15->blues[uVar3].shoot.org = lVar12;
          (pAVar13->ref).org = lVar12;
        }
        pAVar15->blues[uVar3].flags = (uint)uVar1 * 2 & 2;
      }
      pAVar11 = local_378 + 1;
    }
    af_cjk_metrics_check_digits(local_3a0,face);
    face = local_3a8;
  }
  face->charmap = local_390;
  return 0;
LAB_00225754:
  face = (FT_Face)local_3a0;
  pcVar23 = af_shaper_get_cluster(p,&local_3a0->root,&shaper_buf_,&local_3ac);
  pFVar8 = local_3a8;
  if ((((local_3ac < 2) && (face = (FT_Face)shaper_buf_, shaper_buf_ != 0)) &&
      (FVar10 = FT_Load_Glyph(local_3a8,(FT_UInt)shaper_buf_,1), FVar10 == 0)) &&
     (pFVar5 = pFVar8->glyph, 2 < (pFVar5->outline).n_points)) {
    pFVar6 = (pFVar5->outline).points;
    uVar2 = (pFVar5->outline).n_contours;
    face = (FT_Face)0x0;
    if ((short)uVar2 < 1) {
      uVar2 = 0;
    }
    local_398 = &pFVar6->y;
    lVar12 = 0;
    uVar19 = 0xffffffffffffffff;
    iVar21 = 0;
    for (; (AF_CJKMetrics)face != (AF_CJKMetrics)(ulong)uVar2;
        face = (FT_Face)((long)&(((AF_CJKMetrics)face)->root).style_class + 1)) {
      iVar20 = (int)(pFVar5->outline).contours[(long)face];
      if (iVar21 < iVar20) {
        uVar22 = (ulong)iVar21;
        lVar14 = (long)iVar20;
        if ((uVar1 & 2) == 0) {
          if ((uVar1 & 1) == 0) {
            pFVar17 = local_398 + uVar22 * 2;
            for (; (long)uVar22 <= lVar14; uVar22 = uVar22 + 1) {
              if (*pFVar17 < lVar12 || (int)uVar19 < 0) {
                uVar19 = uVar22;
                lVar12 = *pFVar17;
              }
              uVar19 = uVar19 & 0xffffffff;
              pFVar17 = pFVar17 + 2;
            }
          }
          else {
            pFVar17 = local_398 + uVar22 * 2;
            for (; (long)uVar22 <= lVar14; uVar22 = uVar22 + 1) {
              if (lVar12 < *pFVar17 || (int)uVar19 < 0) {
                uVar19 = uVar22;
                lVar12 = *pFVar17;
              }
              uVar19 = uVar19 & 0xffffffff;
              pFVar17 = pFVar17 + 2;
            }
          }
        }
        else {
          pFVar24 = pFVar6 + uVar22;
          if ((uVar1 & 1) == 0) {
            for (; (long)uVar22 <= lVar14; uVar22 = uVar22 + 1) {
              if (pFVar24->x < lVar12 || (int)uVar19 < 0) {
                uVar19 = uVar22;
                lVar12 = pFVar24->x;
              }
              uVar19 = uVar19 & 0xffffffff;
              pFVar24 = pFVar24 + 1;
            }
          }
          else {
            for (; (long)uVar22 <= lVar14; uVar22 = uVar22 + 1) {
              if (lVar12 < pFVar24->x || (int)uVar19 < 0) {
                uVar19 = uVar22;
                lVar12 = pFVar24->x;
              }
              uVar19 = uVar19 & 0xffffffff;
              pFVar24 = pFVar24 + 1;
            }
          }
        }
      }
      iVar21 = iVar20 + 1;
    }
    if (bVar7) {
      uVar19 = (ulong)count;
      count = count + 1;
      fills[uVar19] = lVar12;
    }
    else {
      uVar19 = (ulong)count_00;
      count_00 = count_00 + 1;
      flats[uVar19] = lVar12;
LAB_0022574a:
      bVar7 = false;
    }
  }
  goto LAB_00225729;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_cjk_metrics_init( AF_CJKMetrics  metrics,
                       FT_Face        face )
  {
    FT_CharMap  oldmap = face->charmap;


    metrics->units_per_em = face->units_per_EM;

    if ( !FT_Select_Charmap( face, FT_ENCODING_UNICODE ) )
    {
      af_cjk_metrics_init_widths( metrics, face );
      af_cjk_metrics_init_blues( metrics, face );
      af_cjk_metrics_check_digits( metrics, face );
    }

    face->charmap = oldmap;
    return FT_Err_Ok;
  }